

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

NodeTraversalSignal
prvTidyTraverseNodeTree(TidyDocImpl *doc,Node *node,NodeTraversalCallBack *cb,void *propagate)

{
  NodeTraversalSignal NVar1;
  
  if (node == (Node *)0x0) {
    return ContinueTraversal;
  }
  do {
    NVar1 = (*cb)(doc,node,propagate);
    if ((NVar1 & ~SkipSiblings) == ContinueTraversal && node->content != (Node *)0x0) {
      NVar1 = prvTidyTraverseNodeTree(doc,node->content,cb,propagate);
    }
    if (NVar1 != VisitParent) {
      if (NVar1 - SkipSiblings < 2) {
        return ContinueTraversal;
      }
      if (NVar1 == ExitTraversal) {
        return ExitTraversal;
      }
      node = (Node *)&node->next;
    }
    node = node->parent;
    if (node == (Node *)0x0) {
      return ContinueTraversal;
    }
  } while( true );
}

Assistant:

NodeTraversalSignal TY_(TraverseNodeTree)(TidyDocImpl* doc, Node* node, NodeTraversalCallBack *cb, void *propagate )
{
    while (node)
    {
        NodeTraversalSignal s = (*cb)(doc, node, propagate);

        if (node->content && (s == ContinueTraversal || s == SkipSiblings))
        {
            s = TY_(TraverseNodeTree)(doc, node->content, cb, propagate);
        }

        switch (s)
        {
        case ExitTraversal:
            return ExitTraversal;

        case VisitParent:
            node = node->parent;
            continue;

        case SkipSiblings:
        case SkipChildrenAndSiblings:
            return ContinueTraversal;

        default:
            node = node->next;
            break;
        }
    }
    return ContinueTraversal;
}